

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<Node> __l;
  TypeDescriptor *pTVar1;
  Node *local_158;
  TypeDescriptor *typeDesc;
  Node *local_100;
  Node local_f8;
  string local_b8 [32];
  undefined4 local_98;
  vector<Node,_std::allocator<Node>_> local_90;
  iterator local_78;
  size_type local_70;
  allocator local_51;
  undefined1 local_50 [8];
  Node node;
  
  node.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"apple",&local_51);
  typeDesc._3_1_ = 1;
  node._24_4_ = 3;
  typeDesc._5_1_ = 1;
  local_100 = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"banana",(allocator *)((long)&typeDesc + 7));
  local_f8.value = 7;
  local_f8.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Node,_std::allocator<Node>_>::vector(&local_f8.children);
  local_100 = (Node *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"cherry",(allocator *)((long)&typeDesc + 6));
  local_98 = 0xb;
  local_90.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_90.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_90.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Node,_std::allocator<Node>_>::vector(&local_90);
  typeDesc._5_1_ = 0;
  local_78 = &local_f8;
  local_70 = 2;
  std::allocator<Node>::allocator((allocator<Node> *)((long)&typeDesc + 4));
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<Node,_std::allocator<Node>_>::vector
            ((vector<Node,_std::allocator<Node>_> *)&node.value,__l,
             (allocator<Node> *)((long)&typeDesc + 4));
  typeDesc._3_1_ = 0;
  std::allocator<Node>::~allocator((allocator<Node> *)((long)&typeDesc + 4));
  local_158 = (Node *)&local_78;
  do {
    local_158 = local_158 + -1;
    Node::~Node(local_158);
  } while (local_158 != &local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&typeDesc + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&typeDesc + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pTVar1 = reflect::TypeResolver<Node>::get();
  (*pTVar1->_vptr_TypeDescriptor[3])(pTVar1,local_50,0);
  node.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  Node::~Node((Node *)local_50);
  return node.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    // Create an object of type Node
    Node node = {"apple", 3, {{"banana", 7, {}}, {"cherry", 11, {}}}};

    // Find Node's type descriptor
    reflect::TypeDescriptor* typeDesc = reflect::TypeResolver<Node>::get();

    // Dump a description of the Node object to the console
    typeDesc->dump(&node);

    return 0;
}